

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O1

UINT8 __thiscall DROPlayer::LoadFile(DROPlayer *this,DATA_LOADER *dataLoader)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  pointer *ppuVar1;
  byte bVar2;
  UINT16 UVar3;
  long *plVar4;
  pointer puVar5;
  UINT8 UVar6;
  UINT32 UVar7;
  uint uVar8;
  UINT8 *pUVar9;
  uchar *__args;
  iterator iVar10;
  uchar local_20 [8];
  
  this->_dLoad = (DATA_LOADER *)0x0;
  DataLoader_ReadUntil(dataLoader,0x10);
  pUVar9 = DataLoader_GetData(dataLoader);
  this->_fileData = pUVar9;
  UVar7 = DataLoader_GetSize(dataLoader);
  if (UVar7 < 0x10) {
    return 0xf0;
  }
  plVar4 = (long *)this->_fileData;
  if (*plVar4 != 0x4c504f5741524244) {
    return 0xf0;
  }
  bVar2 = *(byte *)((long)plVar4 + 9);
  if (bVar2 == 0 && *(char *)((long)plVar4 + 0xb) == '\0') {
    if ((char)plVar4[1] == '\0') {
      (this->_fileHdr).verMinor = (ushort)bVar2 << 8;
      (this->_fileHdr).verMajor = *(UINT16 *)((long)plVar4 + 10);
    }
    else {
      (this->_fileHdr).verMajor = CONCAT11(bVar2,(char)plVar4[1]);
      (this->_fileHdr).verMinor = *(UINT16 *)((long)plVar4 + 10);
    }
  }
  else {
    (this->_fileHdr).verMajor = 0;
    (this->_fileHdr).verMinor = 0;
  }
  if (2 < (this->_fileHdr).verMajor) {
    return 0xf1;
  }
  this->_dLoad = dataLoader;
  DataLoader_ReadAll(dataLoader);
  pUVar9 = DataLoader_GetData(this->_dLoad);
  this->_fileData = pUVar9;
  UVar3 = (this->_fileHdr).verMajor;
  if (UVar3 == 2) {
    (this->_fileHdr).dataSize = *(int *)(pUVar9 + 0xc) * 2;
    (this->_fileHdr).lengthMS = *(UINT32 *)(pUVar9 + 0x10);
    (this->_fileHdr).hwType = pUVar9[0x14];
    (this->_fileHdr).format = pUVar9[0x15];
    (this->_fileHdr).compression = pUVar9[0x16];
    (this->_fileHdr).cmdDlyShort = pUVar9[0x17];
    (this->_fileHdr).cmdDlyLong = pUVar9[0x18];
    bVar2 = pUVar9[0x19];
    (this->_fileHdr).regCmdCnt = bVar2;
    (this->_fileHdr).dataOfs = bVar2 + 0x1a;
    if (0x80 < bVar2) {
      (this->_fileHdr).regCmdCnt = 0x80;
    }
    memcpy((this->_fileHdr).regCmdMap,pUVar9 + 0x1a,(ulong)(this->_fileHdr).regCmdCnt);
  }
  else {
    if (UVar3 == 1) {
      (this->_fileHdr).lengthMS = *(UINT32 *)(pUVar9 + 0xc);
      (this->_fileHdr).dataSize = *(UINT32 *)(pUVar9 + 0x10);
      uVar8 = 0xff;
      if (*(uint *)(pUVar9 + 0x14) < 0xff) {
        uVar8 = *(uint *)(pUVar9 + 0x14);
      }
      UVar7 = 0x18;
    }
    else {
      if (UVar3 != 0) goto LAB_0010cdff;
      (this->_fileHdr).lengthMS = *(UINT32 *)(pUVar9 + 8);
      (this->_fileHdr).dataSize = *(UINT32 *)(pUVar9 + 0xc);
      uVar8 = (uint)pUVar9[0x10];
      UVar7 = 0x11;
    }
    (this->_fileHdr).hwType = (UINT8)uVar8;
    (this->_fileHdr).dataOfs = UVar7;
    if ((UINT8)uVar8 == '\x01') {
      UVar6 = '\x02';
LAB_0010cdf1:
      (this->_fileHdr).hwType = UVar6;
    }
    else if ((uVar8 & 0xff) == 2) {
      UVar6 = '\x01';
      goto LAB_0010cdf1;
    }
    (this->_fileHdr).format = '\0';
    (this->_fileHdr).compression = '\0';
    (this->_fileHdr).cmdDlyShort = '\0';
    (this->_fileHdr).cmdDlyLong = '\x01';
    (this->_fileHdr).regCmdCnt = '\0';
  }
LAB_0010cdff:
  ScanInitBlock(this);
  UVar6 = (this->_fileHdr).hwType;
  this->_realHwType = UVar6;
  if ((UVar6 == '\x01' && 1 < (this->_fileHdr).verMajor) &&
     ((UVar6 = (this->_playOpts).v2opl3Mode, UVar6 == '\x02' ||
      (((UVar6 == '\0' &&
        (((this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[4] & 0x20) != 0)) &&
       ((this->_initOPL3Enable & 1) != 0)))))) {
    this->_realHwType = '\x02';
  }
  puVar5 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  puVar5 = (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  this_00 = &this->_devTypes;
  this_01 = &this->_devPanning;
  this->_portShift = '\0';
  if (this->_realHwType == '\x01') {
    local_20[5] = 9;
    iVar10._M_current =
         (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (this_00,iVar10,local_20 + 5);
    }
    else {
      *iVar10._M_current = '\t';
      ppuVar1 = &(this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    local_20[4] = 1;
    iVar10._M_current =
         (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (this_01,iVar10,local_20 + 4);
    }
    else {
      *iVar10._M_current = '\x01';
      ppuVar1 = &(this->_devPanning).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    local_20[3] = 9;
    iVar10._M_current =
         (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (this_00,iVar10,local_20 + 3);
    }
    else {
      *iVar10._M_current = '\t';
      ppuVar1 = &(this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    local_20[2] = 2;
    iVar10._M_current =
         (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      __args = local_20 + 2;
LAB_0010cfd0:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (this_01,iVar10,__args);
      goto LAB_0010d01c;
    }
    *iVar10._M_current = '\x02';
  }
  else {
    if (this->_realHwType != '\0') {
      local_20[1] = 0xc;
      iVar10._M_current =
           (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (this_00,iVar10,local_20 + 1);
      }
      else {
        *iVar10._M_current = '\f';
        ppuVar1 = &(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      local_20[0] = '\0';
      iVar10._M_current =
           (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (this_01,iVar10,local_20);
      }
      else {
        *iVar10._M_current = '\0';
        ppuVar1 = &(this->_devPanning).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      this->_portShift = '\x01';
      goto LAB_0010d01c;
    }
    local_20[7] = 9;
    iVar10._M_current =
         (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (this_00,iVar10,local_20 + 7);
    }
    else {
      *iVar10._M_current = '\t';
      ppuVar1 = &(this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    local_20[6] = 0;
    iVar10._M_current =
         (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      __args = local_20 + 6;
      goto LAB_0010cfd0;
    }
    *iVar10._M_current = '\0';
  }
  ppuVar1 = &(this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + 1;
LAB_0010d01c:
  this->_portMask = ~(byte)(-1 << (this->_portShift & 0x1f));
  this->_totalTicks = (this->_fileHdr).lengthMS;
  GenerateDeviceConfig(this);
  return '\0';
}

Assistant:

UINT8 DROPlayer::LoadFile(DATA_LOADER *dataLoader)
{
	UINT32 tempLng;
	
	_dLoad = NULL;
	DataLoader_ReadUntil(dataLoader,0x10);
	_fileData = DataLoader_GetData(dataLoader);
	if (DataLoader_GetSize(dataLoader) < 0x10 || memcmp(&_fileData[0x00], "DBRAWOPL", 8))
		return 0xF0;	// invalid file
	
	// --- try to detect the DRO version ---
	tempLng = ReadLE32(&_fileData[0x08]);
	if (tempLng & 0xFF00FF00)
	{
		// DRO v0 - This version didn't write version bytes.
		_fileHdr.verMajor = 0x00;
		_fileHdr.verMinor = 0x00;
	}
	else if (! (tempLng & 0x0000FFFF))
	{
		// DRO v1 - order is: minor, major
		_fileHdr.verMinor = ReadLE16(&_fileData[0x08]);
		_fileHdr.verMajor = ReadLE16(&_fileData[0x0A]);
	}
	else
	{
		// DRO v2 - order is: major, minor
		_fileHdr.verMajor = ReadLE16(&_fileData[0x08]);
		_fileHdr.verMinor = ReadLE16(&_fileData[0x0A]);
	}
	if (_fileHdr.verMajor > 2)
		return 0xF1;	// unsupported version
	
	_dLoad = dataLoader;
	DataLoader_ReadAll(_dLoad);
	_fileData = DataLoader_GetData(_dLoad);
	
	switch(_fileHdr.verMajor)
	{
	case 0:	// version 0 (DOSBox 0.62)
	case 1:	// version 1 (DOSBox 0.63)
		switch(_fileHdr.verMajor)
		{
		case 0:
			_fileHdr.lengthMS = ReadLE32(&_fileData[0x08]);
			_fileHdr.dataSize = ReadLE32(&_fileData[0x0C]);
			_fileHdr.hwType = _fileData[0x10];
			_fileHdr.dataOfs = 0x11;
			break;
		case 1:
			_fileHdr.lengthMS = ReadLE32(&_fileData[0x0C]);
			_fileHdr.dataSize = ReadLE32(&_fileData[0x10]);
			tempLng = ReadLE32(&_fileData[0x14]);
			_fileHdr.hwType = (tempLng <= 0xFF) ? (UINT8)tempLng : 0xFF;
			_fileHdr.dataOfs = 0x18;
			break;
		}
		// swap DualOPL2 and OPL3 values
		if (_fileHdr.hwType == 0x01)
			_fileHdr.hwType = DROHW_OPL3;
		else if (_fileHdr.hwType == 0x02)
			_fileHdr.hwType = DROHW_DUALOPL2;
		_fileHdr.format = 0x00;
		_fileHdr.compression = 0x00;
		_fileHdr.cmdDlyShort = 0x00;
		_fileHdr.cmdDlyLong = 0x01;
		_fileHdr.regCmdCnt = 0x00;
		break;
	case 2:	// version 2 (DOSBox 0.73)
		_fileHdr.dataSize = ReadLE32(&_fileData[0x0C]) * 2;
		_fileHdr.lengthMS = ReadLE32(&_fileData[0x10]);
		_fileHdr.hwType = _fileData[0x14];
		_fileHdr.format = _fileData[0x15];
		_fileHdr.compression = _fileData[0x16];
		_fileHdr.cmdDlyShort = _fileData[0x17];
		_fileHdr.cmdDlyLong = _fileData[0x18];
		_fileHdr.regCmdCnt = _fileData[0x19];
		_fileHdr.dataOfs = 0x1A + _fileHdr.regCmdCnt;
		
		if (_fileHdr.regCmdCnt > 0x80)
			_fileHdr.regCmdCnt = 0x80;	// only 0x80 values are possible
		memcpy(_fileHdr.regCmdMap, &_fileData[0x1A], _fileHdr.regCmdCnt);
		
		break;
	}
	
	ScanInitBlock();
	
	_realHwType = _fileHdr.hwType;
	if (_fileHdr.verMajor >= 2)
	{
		// DOSBox puts "DualOPL2" into the header of DROs that log OPL3 data ...
		// ... unless the "4op enable" register is accessed while OPL3 mode is active.
		// This bug was introduced when DRO logging was rewritten for DOSBox 0.73.
		if (_realHwType == DROHW_DUALOPL2)
		{
			switch(_playOpts.v2opl3Mode)
			{
			case DRO_V2OPL3_DETECT:
				// if OPL3 enable is set, it definitely is an OPL3 file
				if (_initRegSet[0x105] && (_initOPL3Enable & 0x01))
					_realHwType = DROHW_OPL3;
				break;
			case DRO_V2OPL3_HEADER:
				// keep the value from the header
				break;
			case DRO_V2OPL3_ENFORCE:
				_realHwType = DROHW_OPL3;
				break;
			}
		}
	}
	
	_devTypes.clear();
	_devPanning.clear();
	_portShift = 0;
	switch(_realHwType)
	{
	case DROHW_OPL2:	// single OPL2
		_devTypes.push_back(DEVID_YM3812);	_devPanning.push_back(0x00);
		break;
	case DROHW_DUALOPL2:	// dual OPL2
		_devTypes.push_back(DEVID_YM3812);	_devPanning.push_back(0x01);
		_devTypes.push_back(DEVID_YM3812);	_devPanning.push_back(0x02);
		break;
	case DROHW_OPL3:	// single OPL3
	default:
		_devTypes.push_back(DEVID_YMF262);	_devPanning.push_back(0x00);
		_portShift = 1;
		break;
	}
	_portMask = (1 << _portShift) - 1;
	
	_totalTicks = _fileHdr.lengthMS;
	GenerateDeviceConfig();
	
	return 0x00;
}